

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryPropertyDescriptor.h
# Opt level: O2

void __thiscall
Js::DictionaryPropertyDescriptor<unsigned_short>::Dump
          (DictionaryPropertyDescriptor<unsigned_short> *this,uint indent)

{
  byte bVar1;
  uint uVar2;
  undefined4 in_register_00000034;
  
  uVar2 = indent + 2;
  Output::Print(L"%*sDictionaryPropertyDescriptor (0x%p)\n",CONCAT44(in_register_00000034,indent),
                L"",this);
  Output::Print(L"%*sPreventFalseReference: %d\n",(ulong)uVar2,L"",(ulong)(this->flags & 1));
  Output::Print(L"%*sIsShadowed: %d\n",(ulong)uVar2,L"",(ulong)(this->flags >> 1 & 1));
  Output::Print(L"%*sIsAccessor: %d\n",(ulong)uVar2,L"",(ulong)(this->flags >> 2 & 1));
  Output::Print(L"%*sIsInitialized: %d\n",(ulong)uVar2,L"",(ulong)(this->flags >> 3 & 1));
  Output::Print(L"%*sIsOnlyOneAccessorInitialized: %d\n",(ulong)uVar2,L"",
                (ulong)(this->flags >> 4 & 1));
  Output::Print(L"%*sIsFixed: %d\n",(ulong)uVar2,L"",(ulong)(this->flags >> 5 & 1));
  Output::Print(L"%*sUsedAsFixed: %d\n",(ulong)uVar2,L"",(ulong)(this->flags >> 6 & 1));
  Output::Print(L"%*sAttributes: 0x%02x ",(ulong)uVar2,L"",(ulong)this->Attributes);
  bVar1 = this->Attributes;
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      Output::Print(L"PropertyEnumerable ");
      bVar1 = this->Attributes;
    }
    if ((bVar1 & 2) != 0) {
      Output::Print(L"PropertyConfigurable ");
      bVar1 = this->Attributes;
    }
    if ((bVar1 & 4) != 0) {
      Output::Print(L"PropertyWritable ");
      bVar1 = this->Attributes;
    }
    if ((bVar1 & 8) != 0) {
      Output::Print(L"PropertyDeleted ");
      bVar1 = this->Attributes;
    }
    if ((bVar1 & 0x10) != 0) {
      Output::Print(L"PropertyLetConstGlobal ");
      bVar1 = this->Attributes;
    }
    if ((bVar1 & 0x20) != 0) {
      Output::Print(L"PropertyDeclaredGlobal ");
      bVar1 = this->Attributes;
    }
    if ((bVar1 & 0x40) != 0) {
      Output::Print(L"PropertyLet ");
      bVar1 = this->Attributes;
    }
    if ((char)bVar1 < '\0') {
      Output::Print(L"PropertyConst ");
    }
  }
  Output::Print(L"\n");
  Output::Print(L"%*sData: %d\n",(ulong)uVar2,L"",(ulong)this->Data);
  Output::Print(L"%*sGetter: %d\n",(ulong)uVar2,L"",(ulong)this->Getter);
  Output::Print(L"%*sSetter: %d\n",(ulong)uVar2,L"",(ulong)this->Setter);
  return;
}

Assistant:

void DictionaryPropertyDescriptor<TPropertyIndex>::Dump(unsigned indent) const
    {
        const auto padding(_u(""));
        const unsigned fieldIndent(indent + 2);

        Output::Print(_u("%*sDictionaryPropertyDescriptor (0x%p)\n"), indent, padding, this);
        Output::Print(_u("%*sPreventFalseReference: %d\n"), fieldIndent, padding, HasFlag(Flags::PreventFalseReference));
        Output::Print(_u("%*sIsShadowed: %d\n"), fieldIndent, padding, GetIsShadowed());
        Output::Print(_u("%*sIsAccessor: %d\n"), fieldIndent, padding, GetIsAccessor());
#if ENABLE_FIXED_FIELDS
        Output::Print(_u("%*sIsInitialized: %d\n"), fieldIndent, padding, GetIsInitialized());
        Output::Print(_u("%*sIsOnlyOneAccessorInitialized: %d\n"), fieldIndent, padding, GetIsOnlyOneAccessorInitialized());
        Output::Print(_u("%*sIsFixed: %d\n"), fieldIndent, padding, GetIsFixed());
        Output::Print(_u("%*sUsedAsFixed: %d\n"), fieldIndent, padding, GetUsedAsFixed());
#endif
        Output::Print(_u("%*sAttributes: 0x%02x "), fieldIndent, padding, this->Attributes);
        if (this->Attributes != PropertyNone)
        {
            if (this->Attributes & PropertyEnumerable) Output::Print(_u("PropertyEnumerable "));
            if (this->Attributes & PropertyConfigurable) Output::Print(_u("PropertyConfigurable "));
            if (this->Attributes & PropertyWritable) Output::Print(_u("PropertyWritable "));
            if (this->Attributes & PropertyDeleted) Output::Print(_u("PropertyDeleted "));
            if (this->Attributes & PropertyLetConstGlobal) Output::Print(_u("PropertyLetConstGlobal "));
            if (this->Attributes & PropertyDeclaredGlobal) Output::Print(_u("PropertyDeclaredGlobal "));
            if (this->Attributes & PropertyLet) Output::Print(_u("PropertyLet "));
            if (this->Attributes & PropertyConst) Output::Print(_u("PropertyConst "));
        }
        Output::Print(_u("\n"));

        Output::Print(_u("%*sData: %d\n"), fieldIndent, padding, static_cast<int32>(this->Data));
        Output::Print(_u("%*sGetter: %d\n"), fieldIndent, padding, static_cast<int32>(this->Getter));
        Output::Print(_u("%*sSetter: %d\n"), fieldIndent, padding, static_cast<int32>(this->Setter));
    }